

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O2

void __thiscall OpenMD::SimInfo::addMoleculeStamp(SimInfo *this,MoleculeStamp *molStamp,int nmol)

{
  int iVar1;
  int curStampId;
  int local_2c;
  MoleculeStamp *local_28;
  
  iVar1 = (int)((ulong)((long)(this->moleculeStamps_).
                              super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->moleculeStamps_).
                             super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_2c = iVar1;
  local_28 = molStamp;
  std::vector<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>::push_back
            (&this->moleculeStamps_,&local_28);
  (this->moleculeStamps_).
  super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>._M_impl.
  super__Vector_impl_data._M_finish[-1]->ident_ = iVar1;
  std::vector<int,_std::allocator<int>_>::insert
            (&this->molStampIds_,
             (const_iterator)
             (this->molStampIds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,(long)nmol,&local_2c);
  return;
}

Assistant:

void SimInfo::addMoleculeStamp(MoleculeStamp* molStamp, int nmol) {
    int curStampId;

    // index from 0
    curStampId = moleculeStamps_.size();

    moleculeStamps_.push_back(molStamp);
    moleculeStamps_[moleculeStamps_.size() - 1]->setIdent(curStampId);
    molStampIds_.insert(molStampIds_.end(), nmol, curStampId);
  }